

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::yypush_(parser_t *this,char *m,stack_symbol_type *sym)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((m != (char *)0x0) && (this->yydebug_ != 0)) {
    poVar1 = this->yycdebug_;
    sVar2 = strlen(m);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,m,sVar2);
    uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 6),1);
    yy_print_<tchecker::parsing::system::parser_t::by_state>
              (this,this->yycdebug_,
               &sym->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>);
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->yycdebug_,(char *)((long)&uStack_28 + 7),1);
  }
  stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
  ::push(&this->yystack_,sym);
  return;
}

Assistant:

void
  parser_t::yypush_ (const char* m, YY_MOVE_REF (stack_symbol_type) sym)
  {
    if (m)
      YY_SYMBOL_PRINT (m, sym);
    yystack_.push (YY_MOVE (sym));
  }